

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

Value * duckdb::PragmaFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  PragmaFunction fun;
  LogicalType LStack_168;
  string local_150;
  PragmaFunction local_130;
  
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (&local_130,&(entry->functions).super_FunctionSet<duckdb::PragmaFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&local_130);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_150,&local_130.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs
              );
    Value::Value(__return_storage_ptr__,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  else {
    LogicalType::LogicalType(&LStack_168,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_168);
    LogicalType::~LogicalType(&LStack_168);
  }
  local_130.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_0248d490;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_130.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_130.super_SimpleNamedParameterFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}